

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox
               (ImDrawList *out_draw_list,ImDrawList *draw_list,ImDrawCmd *draw_cmd,bool show_mesh,
               bool show_aabb)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ImDrawVert *pIVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  unsigned_short *puVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  ImVec2 triangle [3];
  ImVec2 local_e8 [4];
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  ImVec2 local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (show_mesh || show_aabb) {
    if ((draw_list->IdxBuffer).Size < 1) {
      puVar8 = (unsigned_short *)0x0;
    }
    else {
      puVar8 = (draw_list->IdxBuffer).Data;
    }
    uVar2 = draw_cmd->VtxOffset;
    pIVar4 = (draw_list->VtxBuffer).Data;
    fVar11 = (draw_cmd->ClipRect).x;
    fVar13 = (draw_cmd->ClipRect).y;
    fVar10 = (draw_cmd->ClipRect).z;
    fVar9 = (draw_cmd->ClipRect).w;
    uVar3 = out_draw_list->Flags;
    out_draw_list->Flags = uVar3 & 0xfffffffe;
    uVar5 = draw_cmd->IdxOffset;
    uVar7 = (ulong)uVar5;
    if (uVar5 < draw_cmd->ElemCount + uVar5) {
      local_78 = ZEXT416((uint)fVar11);
      local_68 = ZEXT416((uint)fVar13);
      local_58 = ZEXT416((uint)fVar10);
      local_48 = ZEXT416((uint)fVar9);
      fVar11 = -3.4028235e+38;
      local_b8._0_4_ = 3.4028235e+38;
      local_c8._0_4_ = 3.4028235e+38;
      fVar13 = -3.4028235e+38;
      do {
        local_e8[0].x = 0.0;
        local_e8[0].y = 0.0;
        local_e8[1].x = 0.0;
        local_e8[1].y = 0.0;
        local_e8[2].x = 0.0;
        local_e8[2].y = 0.0;
        lVar6 = 0;
        do {
          uVar1 = (uVar7 & 0xffffffff) + lVar6;
          uVar5 = (uint)uVar1;
          if (puVar8 != (unsigned_short *)0x0) {
            uVar5 = (uint)puVar8[uVar1 & 0xffffffff];
          }
          local_e8[lVar6] = pIVar4[(ulong)uVar2 + (ulong)uVar5].pos;
          fVar10 = local_e8[lVar6].x;
          fVar9 = local_e8[lVar6].y;
          local_b8._4_4_ = 0.0;
          fStack_b0 = 0.0;
          fStack_ac = 0.0;
          fVar12 = fVar10;
          if ((float)local_b8._0_4_ <= fVar10) {
            fVar12 = (float)local_b8._0_4_;
          }
          local_b8._0_4_ = fVar12;
          local_c8._4_4_ = 0.0;
          fStack_c0 = 0.0;
          fStack_bc = 0.0;
          fVar12 = fVar9;
          if ((float)local_c8._0_4_ <= fVar9) {
            fVar12 = (float)local_c8._0_4_;
          }
          local_c8._0_4_ = fVar12;
          if (fVar10 <= fVar11) {
            fVar10 = fVar11;
          }
          fVar11 = fVar10;
          if (fVar9 <= fVar13) {
            fVar9 = fVar13;
          }
          fVar13 = fVar9;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        fVar10 = 0.0;
        fVar9 = 0.0;
        fVar12 = 0.0;
        fVar14 = 0.0;
        fVar15 = 0.0;
        fVar16 = 0.0;
        if (show_mesh) {
          _local_98 = ZEXT416((uint)fVar11);
          _local_a8 = ZEXT416((uint)fVar13);
          _local_b8 = ZEXT416((uint)local_b8._0_4_);
          _local_c8 = ZEXT416((uint)local_c8._0_4_);
          ImDrawList::AddPolyline(out_draw_list,local_e8,3,0xff00ffff,1,1.0);
          fVar11 = (float)local_98._0_4_;
          fVar10 = (float)local_98._4_4_;
          fVar9 = fStack_90;
          fVar12 = fStack_8c;
          fVar13 = (float)local_a8._0_4_;
          fVar14 = (float)local_a8._4_4_;
          fVar15 = fStack_a0;
          fVar16 = fStack_9c;
        }
        uVar7 = (uVar7 & 0xffffffff) + 3;
      } while ((uint)uVar7 < draw_cmd->ElemCount + draw_cmd->IdxOffset);
      local_98._4_4_ = (float)(int)(float)local_b8._4_4_;
      local_98._0_4_ = (float)(int)(float)local_b8._0_4_;
      fStack_90 = (float)(int)fStack_b0;
      fStack_8c = (float)(int)fStack_ac;
      local_b8._4_4_ = (float)(int)(float)local_c8._4_4_;
      local_b8._0_4_ = (float)(int)(float)local_c8._0_4_;
      fStack_b0 = (float)(int)fStack_c0;
      fStack_ac = (float)(int)fStack_bc;
      local_a8._4_4_ = (float)(int)fVar10;
      local_a8._0_4_ = (float)(int)fVar11;
      fStack_a0 = (float)(int)fVar9;
      fStack_9c = (float)(int)fVar12;
      local_c8._4_4_ = (float)(int)fVar14;
      local_c8._0_4_ = (float)(int)fVar13;
      fStack_c0 = (float)(int)fVar15;
      fStack_bc = (float)(int)fVar16;
      fVar11 = (float)local_78._0_4_;
      fVar13 = (float)local_68._0_4_;
      fVar9 = (float)local_48._0_4_;
      fVar10 = (float)local_58._0_4_;
    }
    if (show_aabb) {
      local_e8[0].y = (float)(int)fVar13;
      local_e8[0].x = (float)(int)fVar11;
      local_80.y = (float)(int)fVar9;
      local_80.x = (float)(int)fVar10;
      ImDrawList::AddRect(out_draw_list,local_e8,&local_80,0xffff00ff,0.0,0,1.0);
      local_e8[0].y = (float)local_b8._0_4_;
      local_e8[0].x = (float)local_98._0_4_;
      local_80.y = (float)local_c8._0_4_;
      local_80.x = (float)local_a8._0_4_;
      ImDrawList::AddRect(out_draw_list,local_e8,&local_80,0xffffff00,0.0,0,1.0);
    }
    out_draw_list->Flags = uVar3;
    return;
  }
  __assert_fail("show_mesh || show_aabb",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                ,0x2c9f,
                "void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox(ImDrawList *, const ImDrawList *, const ImDrawCmd *, bool, bool)"
               );
}

Assistant:

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox(ImDrawList* out_draw_list, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, bool show_mesh, bool show_aabb)
{
    IM_ASSERT(show_mesh || show_aabb);
    ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
    ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + draw_cmd->VtxOffset;

    // Draw wire-frame version of all triangles
    ImRect clip_rect = draw_cmd->ClipRect;
    ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    ImDrawListFlags backup_flags = out_draw_list->Flags;
    out_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
    for (unsigned int idx_n = draw_cmd->IdxOffset; idx_n < draw_cmd->IdxOffset + draw_cmd->ElemCount; )
    {
        ImVec2 triangle[3];
        for (int n = 0; n < 3; n++, idx_n++)
            vtxs_rect.Add((triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos));
        if (show_mesh)
            out_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), ImDrawFlags_Closed, 1.0f); // In yellow: mesh triangles
    }
    // Draw bounding boxes
    if (show_aabb)
    {
        out_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
        out_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
    }
    out_draw_list->Flags = backup_flags;
}